

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O2

void highbd_mul_shift_sse2(__m128i *x,__m128i *y,__m128i *p,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar11;
  ulong uVar10;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  
  uVar3 = (uint)(*y)[0];
  uVar4 = *(uint *)((long)*y + 4);
  uVar5 = (uint)(*y)[1];
  uVar6 = *(uint *)((long)*y + 0xc);
  uVar9 = (int)uVar3 >> 0x1f;
  uVar11 = (int)uVar4 >> 0x1f;
  uVar12 = (int)uVar5 >> 0x1f;
  uVar13 = (int)uVar6 >> 0x1f;
  auVar7._0_4_ = (uVar3 ^ uVar9) - uVar9;
  auVar7._4_4_ = (uVar4 ^ uVar11) - uVar11;
  auVar7._8_4_ = (uVar5 ^ uVar12) - uVar12;
  auVar7._12_4_ = (uVar6 ^ uVar13) - uVar13;
  auVar14._0_8_ = (ulong)auVar7._0_4_ * ((*x)[0] & 0xffffffffU);
  auVar14._8_8_ = (auVar7._8_8_ & 0xffffffff) * ((*x)[1] & 0xffffffffU);
  auVar8._0_8_ = (ulong)auVar7._4_4_ * ((ulong)(*x)[0] >> 0x20);
  auVar8._8_8_ = (auVar7._8_8_ >> 0x20) * ((ulong)(*x)[1] >> 0x20);
  auVar1._4_4_ = uVar9;
  auVar1._0_4_ = uVar9;
  auVar1._8_4_ = uVar11;
  auVar1._12_4_ = uVar11;
  auVar2._4_4_ = uVar12;
  auVar2._0_4_ = uVar12;
  auVar2._8_4_ = uVar13;
  auVar2._12_4_ = uVar13;
  uVar10 = (ulong)(uint)shift;
  (*p)[0] = ((ulong)(SUB168(auVar8 ^ auVar2,0) - CONCAT44(uVar12,uVar12)) >> uVar10) << 0x20 |
            (ulong)(SUB168(auVar14 ^ auVar1,0) - CONCAT44(uVar9,uVar9)) >> uVar10 & 0xffffffff;
  (*p)[1] = ((ulong)(SUB168(auVar8 ^ auVar2,8) - CONCAT44(uVar13,uVar13)) >> uVar10) << 0x20 |
            (ulong)(SUB168(auVar14 ^ auVar1,8) - CONCAT44(uVar11,uVar11)) >> uVar10 & 0xffffffff;
  return;
}

Assistant:

static inline void highbd_mul_shift_sse2(const __m128i *x, const __m128i *y,
                                         __m128i *p, const int shift) {
  __m128i sign = _mm_srai_epi32(*y, 31);
  __m128i sign_lo = _mm_unpacklo_epi32(sign, sign);
  __m128i sign_hi = _mm_unpackhi_epi32(sign, sign);
  __m128i abs_y = invert_sign_32_sse2(*y, sign);
  __m128i prod_lo = _mm_mul_epu32(*x, abs_y);
  __m128i prod_hi = _mm_srli_epi64(*x, 32);
  const __m128i mult_hi = _mm_srli_epi64(abs_y, 32);
  prod_hi = _mm_mul_epu32(prod_hi, mult_hi);
  prod_lo = highbd_invert_sign_64bit_sse2(prod_lo, sign_lo);
  prod_hi = highbd_invert_sign_64bit_sse2(prod_hi, sign_hi);

  prod_lo = _mm_srli_epi64(prod_lo, shift);
  const __m128i mask = _mm_set_epi32(0, -1, 0, -1);
  prod_lo = _mm_and_si128(prod_lo, mask);
  prod_hi = _mm_srli_epi64(prod_hi, shift);

  prod_hi = _mm_slli_epi64(prod_hi, 32);
  *p = _mm_or_si128(prod_lo, prod_hi);
}